

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  Expr *pEVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  InLoop *pIVar5;
  int in_ECX;
  WhereLevel *in_RDX;
  WhereTerm *in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  WhereLoop *pLoop;
  InLoop *pIn;
  int iTab;
  int eType;
  int iReg;
  Vdbe *v;
  Expr *pX;
  undefined4 in_stack_00000030;
  int in_stack_0000017c;
  Expr *in_stack_00000180;
  Parse *in_stack_00000188;
  undefined8 in_stack_ffffffffffffffa8;
  WhereLoop *pWVar6;
  Vdbe *in_stack_ffffffffffffffb0;
  Vdbe *p;
  int in_stack_ffffffffffffffb8;
  int p2;
  Vdbe *p_00;
  uint local_20;
  
  pEVar1 = in_RSI->pExpr;
  p_00 = *(Vdbe **)(in_RDI + 0x10);
  if (pEVar1->op == 'O') {
    in_R9D = sqlite3ExprCodeTarget(in_stack_00000188,in_stack_00000180,in_stack_0000017c);
  }
  else if (pEVar1->op == 'L') {
    sqlite3VdbeAddOp2(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                      (int)in_stack_ffffffffffffffa8,0);
  }
  else {
    pWVar6 = in_RDX->pWLoop;
    local_20 = in_R8D;
    if ((((pWVar6->wsFlags & 0x400) == 0) && ((pWVar6->u).btree.pIndex != (Index *)0x0)) &&
       (((pWVar6->u).btree.pIndex)->aSortOrder[in_ECX] != '\0')) {
      local_20 = (uint)((in_R8D != 0 ^ 0xffU) & 1);
    }
    iVar3 = sqlite3FindInIndex((Parse *)CONCAT44(iTarget,in_stack_00000030),pX,v._4_4_,_eType);
    if (iVar3 == 4) {
      local_20 = (uint)((local_20 != 0 ^ 0xffU) & 1);
    }
    p2 = pEVar1->iTable;
    sqlite3VdbeAddOp2(in_stack_ffffffffffffffb0,(int)((ulong)pWVar6 >> 0x20),(int)pWVar6,0);
    pWVar6->wsFlags = pWVar6->wsFlags | 0x800;
    if ((in_RDX->u).in.nIn == 0) {
      iVar4 = sqlite3VdbeMakeLabel(in_stack_ffffffffffffffb0);
      in_RDX->addrNxt = iVar4;
    }
    (in_RDX->u).in.nIn = (in_RDX->u).in.nIn + 1;
    pIVar5 = (InLoop *)
             sqlite3DbReallocOrFree
                       ((sqlite3 *)CONCAT44(in_R9D,iVar3),
                        (void *)CONCAT44(p2,in_stack_ffffffffffffffb8),
                        (u64)in_stack_ffffffffffffffb0);
    (in_RDX->u).in.aInLoop = pIVar5;
    pIVar5 = (in_RDX->u).in.aInLoop;
    if (pIVar5 == (InLoop *)0x0) {
      (in_RDX->u).in.nIn = 0;
    }
    else {
      p = (Vdbe *)(pIVar5 + ((in_RDX->u).in.nIn + -1));
      *(int *)&p->db = p2;
      if (iVar3 == 1) {
        iVar3 = sqlite3VdbeAddOp2(p,(int)((ulong)pWVar6 >> 0x20),(int)pWVar6,0);
        *(int *)((long)&p->db + 4) = iVar3;
      }
      else {
        iVar3 = sqlite3VdbeAddOp3(p_00,in_R9D,iVar3,p2,in_stack_ffffffffffffffb8);
        *(int *)((long)&p->db + 4) = iVar3;
      }
      uVar2 = 7;
      if (local_20 != 0) {
        uVar2 = 6;
      }
      *(undefined1 *)&p->aOp = uVar2;
      sqlite3VdbeAddOp1(p,(int)((ulong)pWVar6 >> 0x20),(int)pWVar6);
    }
  }
  disableTerm(in_RDX,in_RSI);
  return in_R9D;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( iTarget>0 );
  if( pX->op==TK_EQ ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;
    eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0);
    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    iTab = pX->iTable;
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);
    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );
    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(v);
    }
    pLevel->u.in.nIn++;
    pLevel->u.in.aInLoop =
       sqlite3DbReallocOrFree(pParse->db, pLevel->u.in.aInLoop,
                              sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      pIn += pLevel->u.in.nIn - 1;
      pIn->iCur = iTab;
      if( eType==IN_INDEX_ROWID ){
        pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iReg);
      }else{
        pIn->addrInTop = sqlite3VdbeAddOp3(v, OP_Column, iTab, 0, iReg);
      }
      pIn->eEndLoopOp = bRev ? OP_PrevIfOpen : OP_NextIfOpen;
      sqlite3VdbeAddOp1(v, OP_IsNull, iReg); VdbeCoverage(v);
    }else{
      pLevel->u.in.nIn = 0;
    }
#endif
  }
  disableTerm(pLevel, pTerm);
  return iReg;
}